

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

int payload_size_in_limit(cio_write_buffer *payload,size_t limit)

{
  cio_write_buffer *local_30;
  cio_write_buffer *element;
  size_t payload_length;
  size_t limit_local;
  cio_write_buffer *payload_local;
  
  if (payload != (cio_write_buffer *)0x0) {
    element = (cio_write_buffer *)0x0;
    for (local_30 = payload->next; local_30 != payload; local_30 = local_30->next) {
      element = (cio_write_buffer *)((long)&element->next + (local_30->data).element.length);
    }
    if (limit < element) {
      return 0;
    }
  }
  return 1;
}

Assistant:

static int payload_size_in_limit(const struct cio_write_buffer *payload, size_t limit)
{
	if (cio_likely(payload != NULL)) {
		size_t payload_length = 0;

		const struct cio_write_buffer *element = payload->next;
		while (element != payload) {
			payload_length += element->data.element.length;
			element = element->next;
		}

		if (cio_unlikely(payload_length > limit)) {
			return 0;
		}
	}

	return 1;
}